

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void most_hostile_types::
     test_interface_with_relops_for<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,most_hostile_types::with_order_none::Ref,most_hostile_types::with_order_none::Rep,most_hostile_types::with_order_none::Store>,most_hostile_types::order_custom>
               (void)

{
  value_type local_1c;
  bool b;
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
  mh2;
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
  mh1;
  
  test_interface_for<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,most_hostile_types::with_order_none::Ref,most_hostile_types::with_order_none::Rep,most_hostile_types::with_order_none::Store>,most_hostile_types::order_custom>
            ();
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
  ::markable(&mh2);
  local_1c.v = 1;
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
  ::markable((markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
              *)&stack0xffffffffffffffe8,&local_1c);
  ak_toolkit::markable_ns::operator<
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  ak_toolkit::markable_ns::operator>
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  ak_toolkit::markable_ns::operator<=
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  ak_toolkit::markable_ns::operator>=
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  ak_toolkit::markable_ns::operator==
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  ak_toolkit::markable_ns::operator!=
            (&mh2,(markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_most_hostile_types::order_custom>
                   *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void test_interface_with_relops_for()
  {
    using Val = typename markable<MP, OP>::value_type;

    test_interface_for<MP, OP>();
    markable<MP, OP> mh1, mh2{Val{1}};
    bool b = false;
    b = (mh1 < mh2);
    b = (mh1 > mh2);
    b = (mh1 <= mh2);
    b = (mh1 >= mh2);
    b = (mh1 == mh2);
    b = (mh1 != mh2);
    (void)b;
  }